

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void shkgone(monst *mtmp)

{
  undefined1 *puVar1;
  char cVar2;
  char cVar3;
  level *lev;
  bool bVar4;
  xchar xVar5;
  boolean bVar6;
  mkroom *pmVar7;
  long lVar8;
  char *pcVar9;
  char cVar10;
  char cVar11;
  long lVar12;
  monst *pmVar13;
  
  xVar5 = ledger_no((d_level *)&mtmp[0x1b].mxlth);
  lev = levels[xVar5];
  cVar3 = (char)mtmp[0x1b].meating;
  remove_damage(mtmp,'\x01');
  *(undefined8 *)((long)lev->monsters + (long)cVar3 * 0xd8 + 0x3428) = 0;
  pmVar7 = search_special(lev,-2);
  if (pmVar7 == (mkroom *)0x0) {
    puVar1 = &(lev->flags).field_0x8;
    *puVar1 = *puVar1 & 0xfe;
  }
  cVar2 = *(char *)((long)lev->monsters + (long)cVar3 * 0xd8 + 0x3358);
  cVar11 = *(char *)((long)lev->monsters + (long)cVar3 * 0xd8 + 0x3359);
  if (cVar2 <= cVar11) {
    cVar10 = *(char *)((long)lev->monsters + (long)cVar3 * 0xd8 + 0x335b);
    lVar8 = (long)cVar2;
    do {
      cVar2 = *(char *)((long)lev->monsters + (long)cVar3 * 0xd8 + 0x335a);
      lVar12 = (long)cVar2;
      if (cVar2 <= cVar10) {
        do {
          pmVar13 = (monst *)lev->objects[lVar8][lVar12];
          if (pmVar13 != (monst *)0x0) {
            do {
              pmVar13->mtrack[3].x = pmVar13->mtrack[3].x & 0xf7;
              pmVar13 = ((vptrs *)&pmVar13->data)->v_ocarry;
            } while (pmVar13 != (monst *)0x0);
            cVar10 = *(char *)((long)lev->monsters + (long)cVar3 * 0xd8 + 0x335b);
          }
          bVar4 = lVar12 < cVar10;
          lVar12 = lVar12 + 1;
        } while (bVar4);
        cVar11 = *(char *)((long)lev->monsters + (long)cVar3 * 0xd8 + 0x3359);
      }
      bVar4 = lVar8 < cVar11;
      lVar8 = lVar8 + 1;
    } while (bVar4);
  }
  bVar6 = on_level((d_level *)&mtmp[0x1b].mxlth,&mtmp->dlevel->z);
  if ((bVar6 != '\0') &&
     (pcVar9 = strchr(u.ushops,(int)(char)mtmp[0x1b].meating), pcVar9 != (char *)0x0)) {
    setpaid(mtmp);
    mtmp[0x1b].mnum = 0;
    mtmp[0x1b].m_lev = '\0';
    mtmp[0x1b].mx = '\0';
    mtmp[0x1b].my = '\0';
    mtmp[0x1b].mux = '\0';
    mtmp[0x1b].muy = '\0';
    mtmp[0x1b].malign = '\0';
    do {
      cVar3 = pcVar9[1];
      *pcVar9 = cVar3;
      pcVar9 = pcVar9 + 1;
    } while (cVar3 != '\0');
  }
  return;
}

Assistant:

void shkgone(struct monst *mtmp)
{
	struct eshk *eshk = ESHK(mtmp);
	struct level *shoplev = levels[ledger_no(&eshk->shoplevel)];
	struct mkroom *sroom = &shoplev->rooms[eshk->shoproom - ROOMOFFSET];
	struct obj *otmp;
	char *p;
	int sx, sy;

	remove_damage(mtmp, TRUE);
	sroom->resident = NULL;
	if (!search_special(shoplev, ANY_SHOP))
	    shoplev->flags.has_shop = 0;

	/* items on shop floor revert to ordinary objects */
	for (sx = sroom->lx; sx <= sroom->hx; sx++)
	    for (sy = sroom->ly; sy <= sroom->hy; sy++)
	    for (otmp = shoplev->objects[sx][sy]; otmp; otmp = otmp->nexthere)
		otmp->no_charge = 0;

	if (on_level(&eshk->shoplevel, &mtmp->dlevel->z)) {
	    /* Make sure bill is set only when the
	       dead shk is the resident shk. */
	    if ((p = strchr(u.ushops, eshk->shoproom)) != 0) {
		setpaid(mtmp);
		eshk->bill_p = NULL;
		/* remove eshk->shoproom from u.ushops */
		do { *p = *(p + 1); } while (*++p);
	    }
	}
}